

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O0

Type wabt::GetMemoryType(Type operand_type,Opcode opc)

{
  Opcode *this;
  Enum EVar1;
  Address AVar2;
  char *str;
  size_type sVar3;
  string_view local_50;
  string_view local_40;
  byte local_29;
  undefined1 local_28 [7];
  bool is_unsigned;
  string_view name;
  Type local_10;
  Opcode opc_local;
  Type operand_type_local;
  
  name.size_._4_4_ = opc.enum_;
  local_10.enum_ = operand_type.enum_;
  EVar1 = Type::operator_cast_to_Enum(&local_10);
  if ((EVar1 == I32) || (EVar1 = Type::operator_cast_to_Enum(&local_10), EVar1 == I64)) {
    this = (Opcode *)((long)&name.size_ + 4);
    str = Opcode::GetName(this);
    string_view::string_view((string_view *)local_28,str);
    sVar3 = string_view::size((string_view *)local_28);
    local_40 = string_view::substr((string_view *)local_28,sVar3 - 2,0xffffffffffffffff);
    string_view::string_view(&local_50,"_u");
    local_29 = operator==(local_40,local_50);
    AVar2 = Opcode::GetMemorySize(this);
    if (AVar2 == 1) {
      EVar1 = I8;
      if ((local_29 & 1) != 0) {
        EVar1 = I8U;
      }
      Type::Type((Type *)&opc_local,EVar1);
      return (Type)opc_local.enum_;
    }
    if (AVar2 == 2) {
      EVar1 = I16;
      if ((local_29 & 1) != 0) {
        EVar1 = I16U;
      }
      Type::Type((Type *)&opc_local,EVar1);
      return (Type)opc_local.enum_;
    }
    if (AVar2 == 4) {
      EVar1 = I32;
      if ((local_29 & 1) != 0) {
        EVar1 = I32U;
      }
      Type::Type((Type *)&opc_local,EVar1);
      return (Type)opc_local.enum_;
    }
  }
  return (Type)local_10.enum_;
}

Assistant:

inline Type GetMemoryType(Type operand_type, Opcode opc) {
  // TODO: something something SIMD.
  // TODO: this loses information of the type it is read into.
  // That may well not be the biggest deal since that is usually obvious
  // from context, if not, we should probably represent that as a cast around
  // the access, since it should not be part of the field type.
  if (operand_type == Type::I32 || operand_type == Type::I64) {
    auto name = string_view(opc.GetName());
    // FIXME: change into a new column in opcode.def instead?
    auto is_unsigned = name.substr(name.size() - 2) == "_u";
    switch (opc.GetMemorySize()) {
      case 1: return is_unsigned ? Type::I8U : Type::I8;
      case 2: return is_unsigned ? Type::I16U : Type::I16;
      case 4: return is_unsigned ? Type::I32U : Type::I32;
    }
  }
  return operand_type;
}